

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<float>
          (internal *this,char *lhs_expression,char *rhs_expression,float lhs_value,float rhs_value)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  string local_3a0;
  string local_380;
  int local_35c;
  stringstream local_358 [8];
  stringstream rhs_ss;
  ostream local_348 [396];
  int local_1bc;
  stringstream local_1b8 [8];
  stringstream lhs_ss;
  ostream local_1a8 [376];
  FloatingPoint<float> local_30;
  FloatingPoint<float> local_2c;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  float rhs_value_local;
  float lhs_value_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  rhs.u_ = (FloatingPointUnion)rhs_value;
  lhs.u_ = (FloatingPointUnion)lhs_value;
  FloatingPoint<float>::FloatingPoint(&local_2c,(float *)&lhs);
  FloatingPoint<float>::FloatingPoint(&local_30,(float *)&rhs);
  bVar1 = FloatingPoint<float>::AlmostEquals(&local_2c,&local_30);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1bc = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_1a8,(_Setprecision)local_1bc);
    std::ostream::operator<<(poVar2,(float)lhs.u_);
    std::__cxx11::stringstream::stringstream(local_358);
    local_35c = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_348,(_Setprecision)local_35c);
    std::ostream::operator<<(poVar2,(float)rhs.u_);
    StringStreamToString(&local_380,(stringstream *)local_1b8);
    StringStreamToString(&local_3a0,(stringstream *)local_358);
    EqFailure(this,lhs_expression,rhs_expression,&local_380,&local_3a0,false);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::stringstream::~stringstream(local_358);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}